

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::csharp::MessageGenerator::HasNestedGeneratedTypes
          (MessageGenerator *this)

{
  long *plVar1;
  uint uVar2;
  Descriptor *pDVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  pDVar3 = this->descriptor_;
  if (*(int *)(pDVar3 + 0x74) < 1) {
    uVar2 = *(uint *)(pDVar3 + 0x70);
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    lVar6 = 0x20;
    do {
      if (uVar5 == uVar4) {
        return (long)uVar4 < (long)(int)uVar2;
      }
      plVar1 = (long *)(*(long *)(pDVar3 + 0x38) + lVar6);
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x88;
    } while (*(char *)(*plVar1 + 0x4b) != '\0');
  }
  return true;
}

Assistant:

bool MessageGenerator::HasNestedGeneratedTypes()
{
  if (descriptor_->enum_type_count() > 0) {
    return true;
  }
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
      return true;
    }
  }
  return false;
}